

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::TextureDerivateCase::verify
          (TextureDerivateCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  Vec4 *scale;
  Vec4 *bias;
  ostringstream *poVar1;
  Precision precision;
  ulong uVar2;
  Vec4 VVar3;
  bool bVar4;
  int i;
  DataType DVar5;
  int iVar6;
  undefined7 extraout_var;
  undefined8 uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined7 extraout_var_00;
  NotSupportedError *this_00;
  long lVar9;
  float *pfVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  float fVar20;
  float afVar17 [4];
  undefined1 auVar18 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar19 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar34;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined4 uVar39;
  Vector<float,_2> res_5;
  Vec4 threshold_1;
  Vec4 threshold;
  Vec4 reference;
  int local_278;
  int iStack_274;
  float local_268 [4];
  Vec4 surfaceThreshold;
  float local_248 [4];
  Vec4 opThreshold;
  PixelBufferAccess maskArea;
  ConstPixelBufferAccess compareArea;
  Vector<float,_4> res_2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [5];
  ios_base local_150 [264];
  Vector<float,_4> res_17;
  long lVar38;
  
  if ((1 < *(int *)(ctx + 8)) && (1 < *(int *)(ctx + 0xc))) {
    tcu::getSubregion(&compareArea,(ConstPixelBufferAccess *)ctx,1,1,*(int *)(ctx + 8) + -2,
                      *(int *)(ctx + 0xc) + -2);
    tcu::getSubregion(&maskArea,(PixelBufferAccess *)sig,1,1,*(int *)(sig + 8) + -2,
                      *(int *)(sig + 0xc) + -2);
    local_268[0] = 1.0;
    local_268[1] = 0.0;
    local_268[2] = 0.5;
    local_268[3] = -0.5;
    local_248[0] = 0.0;
    local_248[1] = 1.0;
    local_248[2] = 0.5;
    local_248[3] = -0.5;
    uVar7 = *(undefined8 *)(ctx + 8);
    TriangleDerivateCase::getSurfaceThreshold((TriangleDerivateCase *)&res_2);
    scale = &(this->super_TriangleDerivateCase).m_derivScale;
    auVar24 = *(undefined1 (*) [16])(this->super_TriangleDerivateCase).m_derivScale.m_data;
    auVar26._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
    auVar26._8_4_ = auVar24._8_4_ ^ 0x80000000;
    auVar26._12_4_ = auVar24._12_4_ ^ 0x80000000;
    auVar24 = maxps(auVar26,auVar24);
    afVar17 = (float  [4])divps(res_2.m_data,auVar24);
    surfaceThreshold.m_data[0] = afVar17[0];
    surfaceThreshold.m_data[1] = afVar17[1];
    surfaceThreshold.m_data[2] = afVar17[2];
    surfaceThreshold.m_data[3] = afVar17[3];
    local_278 = (int)uVar7;
    iStack_274 = (int)((ulong)uVar7 >> 0x20);
    auVar24._0_4_ = (float)local_278;
    auVar24._4_4_ = (float)iStack_274;
    auVar24._8_8_ = 0;
    uVar13 = *(uint *)&(this->super_TriangleDerivateCase).field_0xf4;
    auVar35._0_8_ = CONCAT44(auVar24._4_4_,auVar24._4_4_);
    auVar35._8_4_ = auVar24._4_4_;
    auVar35._12_4_ = auVar24._4_4_;
    if (uVar13 < 2) {
      auVar25._0_4_ = (this->m_texValueMax).m_data[0] - (this->m_texValueMin).m_data[0];
      auVar25._4_4_ = (this->m_texValueMax).m_data[1] - (this->m_texValueMin).m_data[1];
      auVar25._8_4_ = (this->m_texValueMax).m_data[2] - (this->m_texValueMin).m_data[2];
      auVar25._12_4_ = (this->m_texValueMax).m_data[3] - (this->m_texValueMin).m_data[3];
      pfVar10 = local_248;
      if (uVar13 == 0) {
        pfVar10 = local_268;
      }
      fVar20 = *pfVar10;
      fVar22 = pfVar10[1];
      fVar28 = pfVar10[2];
      fVar34 = pfVar10[3];
      auVar29 = auVar24;
      if (uVar13 != 0) {
        auVar29._8_4_ = auVar24._4_4_;
        auVar29._0_8_ = auVar35._0_8_;
        auVar29._12_4_ = auVar24._4_4_;
      }
      auVar30._0_4_ = auVar29._0_4_;
      auVar30._4_4_ = auVar30._0_4_;
      auVar30._8_4_ = auVar30._0_4_;
      auVar30._12_4_ = auVar30._0_4_;
      auVar26 = divps(auVar25,auVar30);
      reference.m_data[1] = auVar26._4_4_ * fVar22;
      reference.m_data[0] = auVar26._0_4_ * fVar20;
      reference.m_data[2] = auVar26._8_4_ * fVar28;
      reference.m_data[3] = auVar26._12_4_ * fVar34;
      res_2.m_data[1] = (this->m_texValueMin).m_data[1] * fVar22;
      res_2.m_data[0] = (this->m_texValueMin).m_data[0] * fVar20;
      res_2.m_data[2] = (this->m_texValueMin).m_data[2] * fVar28;
      res_2.m_data[3] = (this->m_texValueMin).m_data[3] * fVar34;
      threshold.m_data[1] = (this->m_texValueMax).m_data[1] * fVar22;
      threshold.m_data[0] = (this->m_texValueMax).m_data[0] * fVar20;
      threshold.m_data[3] = (this->m_texValueMax).m_data[3] * fVar34;
      threshold.m_data[2] = (this->m_texValueMax).m_data[2] * fVar28;
      getDerivateThreshold
                ((Functional *)&opThreshold,(this->super_TriangleDerivateCase).m_precision,&res_2,
                 &threshold,&reference);
      threshold.m_data[1] =
           (float)(~-(uint)(opThreshold.m_data[1] <= surfaceThreshold.m_data[1]) &
                   (uint)opThreshold.m_data[1] |
                  (uint)surfaceThreshold.m_data[1] &
                  -(uint)(opThreshold.m_data[1] <= surfaceThreshold.m_data[1]));
      threshold.m_data[0] =
           (float)(~-(uint)(opThreshold.m_data[0] <= surfaceThreshold.m_data[0]) &
                   (uint)opThreshold.m_data[0] |
                  (uint)surfaceThreshold.m_data[0] &
                  -(uint)(opThreshold.m_data[0] <= surfaceThreshold.m_data[0]));
      threshold.m_data[3] =
           (float)(~-(uint)(opThreshold.m_data[3] <= surfaceThreshold.m_data[3]) &
                   (uint)opThreshold.m_data[3] |
                  (uint)surfaceThreshold.m_data[3] &
                  -(uint)(opThreshold.m_data[3] <= surfaceThreshold.m_data[3]));
      threshold.m_data[2] =
           (float)(~-(uint)(opThreshold.m_data[2] <= surfaceThreshold.m_data[2]) &
                   (uint)opThreshold.m_data[2] |
                  (uint)surfaceThreshold.m_data[2] &
                  -(uint)(opThreshold.m_data[2] <= surfaceThreshold.m_data[2]));
      DVar5 = glu::getDataTypeFloatScalars((this->super_TriangleDerivateCase).m_dataType);
      res_2.m_data._0_8_ =
           ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      poVar1 = (ostringstream *)(res_2.m_data + 2);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Verifying result image.\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\tValid derivative is ",0x15);
      VVar3 = reference;
      if (DVar5 == TYPE_FLOAT_VEC3) {
        res_5.m_data[0] = reference.m_data[0];
        res_5.m_data[1] = reference.m_data[1];
        reference = VVar3;
        tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)&res_5);
      }
      else if (DVar5 == TYPE_FLOAT_VEC2) {
        res_5.m_data[0] = reference.m_data[0];
        res_5.m_data[1] = reference.m_data[1];
        reference = VVar3;
        tcu::operator<<((ostream *)poVar1,&res_5);
      }
      else if (DVar5 == TYPE_FLOAT) {
        std::ostream::_M_insert<double>((double)reference.m_data[0]);
      }
      else {
        tcu::operator<<((ostream *)poVar1,&reference);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," with threshold ",0x10);
      if (DVar5 == TYPE_FLOAT_VEC3) {
        res_5.m_data[0] = threshold.m_data[0];
        res_5.m_data[1] = threshold.m_data[1];
        tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)&res_5);
      }
      else if (DVar5 == TYPE_FLOAT_VEC2) {
        res_5.m_data[0] = threshold.m_data[0];
        res_5.m_data[1] = threshold.m_data[1];
        tcu::operator<<((ostream *)poVar1,&res_5);
      }
      else if (DVar5 == TYPE_FLOAT) {
        std::ostream::_M_insert<double>((double)threshold.m_data[0]);
      }
      else {
        tcu::operator<<((ostream *)poVar1,&threshold);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_150);
      bias = &(this->super_TriangleDerivateCase).m_derivBias;
      bVar4 = verifyConstantDerivate
                        (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_log,&compareArea,&maskArea,
                         (this->super_TriangleDerivateCase).m_dataType,&reference,&threshold,scale,
                         bias,LOG_NOTHING);
      if (bVar4) {
        poVar1 = (ostringstream *)(res_2.m_data + 2);
        res_2.m_data._0_8_ =
             ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"No incorrect derivatives found, result valid.",0x2d);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        uVar7 = std::ios_base::~ios_base(local_150);
        iVar6 = (int)CONCAT71((int7)((ulong)uVar7 >> 8),1);
      }
      else {
        poVar1 = (ostringstream *)(res_2.m_data + 2);
        res_2.m_data._0_8_ =
             ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
                   ,0x69);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "\tVerifying each result derivative is within its range of legal result values.",
                   0x4d);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res_2,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_150);
        fVar20 = (this->m_texValueMin).m_data[0];
        fVar22 = (this->m_texValueMin).m_data[1];
        fVar28 = (this->m_texValueMax).m_data[0];
        fVar34 = (this->m_texValueMax).m_data[1];
        fVar21 = (this->m_texValueMax).m_data[2] - (this->m_texValueMin).m_data[2];
        fVar23 = (this->m_texValueMax).m_data[3] - (this->m_texValueMin).m_data[3];
        local_1a8[0]._M_allocated_capacity = 0;
        local_1a8[0]._8_8_ = 0;
        local_1b8._M_allocated_capacity = 0;
        local_1b8._8_8_ = 0;
        res_2.m_data = (float  [4])ZEXT816(0);
        paVar8 = &local_1b8;
        lVar9 = 0;
        lVar11 = 0;
        do {
          lVar12 = 0;
          auVar37 = _DAT_019fcc00;
          do {
            bVar4 = SUB164(auVar37 ^ _DAT_019f5ce0,4) == -0x80000000 &&
                    SUB164(auVar37 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
            if (bVar4) {
              uVar39 = 0x3f800000;
              if (lVar9 != lVar12) {
                uVar39 = 0;
              }
              *(undefined4 *)((long)paVar8 + lVar12 + -0x10) = uVar39;
            }
            if (bVar4) {
              uVar39 = 0x3f800000;
              if (lVar9 + -0x10 != lVar12) {
                uVar39 = 0;
              }
              *(undefined4 *)((long)paVar8 + lVar12) = uVar39;
            }
            lVar38 = auVar37._8_8_;
            auVar37._0_8_ = auVar37._0_8_ + 2;
            auVar37._8_8_ = lVar38 + 2;
            lVar12 = lVar12 + 0x20;
          } while (lVar12 != 0x40);
          lVar11 = lVar11 + 1;
          lVar9 = lVar9 + 0x10;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar8->_M_local_buf + 4);
        } while (lVar11 != 4);
        res_5.m_data[1] = 0.0;
        res_5.m_data[0] = (fVar28 - fVar20) / auVar24._0_4_;
        lVar9 = 0;
        do {
          res_2.m_data[lVar9] = *(float *)((long)res_5.m_data + lVar9);
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0xc);
        res_5.m_data = (float  [2])((ulong)(uint)((fVar34 - fVar22) / auVar24._4_4_) << 0x20);
        lVar9 = 1;
        do {
          res_2.m_data[lVar9] = *(float *)((long)threshold_1.m_data + lVar9 + -0x11);
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0xd);
        fVar20 = (this->m_texValueMin).m_data[2];
        auVar33._4_4_ = fVar21;
        auVar33._0_4_ = fVar21;
        auVar33._8_4_ = fVar23;
        auVar33._12_4_ = fVar23;
        auVar26 = divps(auVar33,auVar24);
        threshold_1.m_data[0] = (float)auVar26._0_8_;
        threshold_1.m_data[1] = SUB84(auVar26._0_8_,4);
        threshold_1.m_data[2] = fVar20 + fVar20;
        res_5.m_data[0] = 0.0;
        res_5.m_data[1] = 0.0;
        lVar9 = 0;
        do {
          res_5.m_data[lVar9] = threshold_1.m_data[lVar9] * 0.5;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        lVar9 = 2;
        do {
          res_2.m_data[lVar9] = *(float *)((long)threshold_1.m_data + lVar9 + -0x12);
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0xe);
        fVar20 = (this->m_texValueMax).m_data[3];
        auVar19._0_8_ = CONCAT44(fVar23,fVar23) ^ 0x8000000080000000;
        auVar19._8_4_ = -fVar23;
        auVar19._12_4_ = -fVar23;
        auVar24 = divps(auVar19,auVar24);
        threshold_1.m_data[0] = (float)auVar24._0_8_;
        threshold_1.m_data[1] = SUB84(auVar24._0_8_,4);
        threshold_1.m_data[2] = fVar20 + fVar20;
        res_5.m_data[0] = 0.0;
        res_5.m_data[1] = 0.0;
        lVar9 = 0;
        do {
          res_5.m_data[lVar9] = threshold_1.m_data[lVar9] * 0.5;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        lVar9 = 3;
        do {
          res_2.m_data[lVar9] = *(float *)((long)threshold_1.m_data + lVar9 + -0x13);
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0xf);
        bVar4 = reverifyConstantDerivateWithFlushRelaxations
                          (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx)->m_log,&compareArea,&maskArea,
                           (this->super_TriangleDerivateCase).m_dataType,
                           (this->super_TriangleDerivateCase).m_precision,scale,bias,
                           &surfaceThreshold,
                           *(DerivateFunc *)&(this->super_TriangleDerivateCase).field_0xf4,
                           (Linear2DFunctionEvaluator *)&res_2);
        iVar6 = (int)CONCAT71(extraout_var_00,bVar4);
      }
    }
    else {
      auVar27._0_4_ = (this->m_texValueMax).m_data[0] - (this->m_texValueMin).m_data[0];
      auVar27._4_4_ = (this->m_texValueMax).m_data[1] - (this->m_texValueMin).m_data[1];
      auVar27._8_4_ = (this->m_texValueMax).m_data[2] - (this->m_texValueMin).m_data[2];
      auVar27._12_4_ = (this->m_texValueMax).m_data[3] - (this->m_texValueMin).m_data[3];
      auVar31._4_4_ = auVar24._0_4_;
      auVar31._0_4_ = auVar24._0_4_;
      auVar31._8_4_ = auVar24._0_4_;
      auVar31._12_4_ = auVar24._0_4_;
      auVar24 = divps(auVar27,auVar31);
      res_2.m_data[0] = auVar24._0_4_ * local_268[0];
      res_2.m_data[1] = auVar24._4_4_ * local_268[1];
      res_2.m_data[2] = auVar24._8_4_ * local_268[2];
      res_2.m_data[3] = auVar24._12_4_ * local_268[3];
      auVar32._0_4_ = (this->m_texValueMax).m_data[0] - (this->m_texValueMin).m_data[0];
      auVar32._4_4_ = (this->m_texValueMax).m_data[1] - (this->m_texValueMin).m_data[1];
      auVar32._8_4_ = (this->m_texValueMax).m_data[2] - (this->m_texValueMin).m_data[2];
      auVar32._12_4_ = (this->m_texValueMax).m_data[3] - (this->m_texValueMin).m_data[3];
      auVar24 = divps(auVar32,auVar35);
      reference.m_data[0] = auVar24._0_4_ * local_248[0];
      reference.m_data[1] = auVar24._4_4_ * local_248[1];
      reference.m_data[2] = auVar24._8_4_ * local_248[2];
      reference.m_data[3] = auVar24._12_4_ * local_248[3];
      uVar2 = CONCAT44(res_2.m_data[1],res_2.m_data[0]);
      auVar36._0_8_ = uVar2 ^ 0x8000000080000000;
      auVar36._8_4_ = -res_2.m_data[2];
      auVar36._12_4_ = -res_2.m_data[3];
      auVar26 = maxps(auVar36,(undefined1  [16])res_2.m_data);
      uVar2 = CONCAT44(reference.m_data[1],reference.m_data[0]);
      auVar18._0_8_ = uVar2 ^ 0x8000000080000000;
      auVar18._8_4_ = -reference.m_data[2];
      auVar18._12_4_ = -reference.m_data[3];
      auVar24 = maxps(auVar18,(undefined1  [16])reference.m_data);
      opThreshold.m_data[0] = auVar24._0_4_ + auVar26._0_4_;
      opThreshold.m_data[1] = auVar24._4_4_ + auVar26._4_4_;
      opThreshold.m_data[2] = auVar24._8_4_ + auVar26._8_4_;
      opThreshold.m_data[3] = auVar24._12_4_ + auVar26._12_4_;
      precision = (this->super_TriangleDerivateCase).m_precision;
      fVar20 = (this->m_texValueMin).m_data[2] * local_268[2];
      fVar22 = (this->m_texValueMin).m_data[3] * local_268[3];
      res_5.m_data[1] = (this->m_texValueMin).m_data[1] * local_268[1];
      res_5.m_data[0] = (this->m_texValueMin).m_data[0] * local_268[0];
      threshold_1.m_data[1] = (this->m_texValueMax).m_data[1] * local_268[1];
      threshold_1.m_data[0] = (this->m_texValueMax).m_data[0] * local_268[0];
      threshold_1.m_data[3] = (this->m_texValueMax).m_data[3] * local_268[3];
      threshold_1.m_data[2] = (this->m_texValueMax).m_data[2] * local_268[2];
      getDerivateThreshold((Functional *)&threshold,precision,(Vec4 *)&res_5,&threshold_1,&res_2);
      threshold_1.m_data[1] = (this->m_texValueMin).m_data[1] * local_248[1];
      threshold_1.m_data[0] = (this->m_texValueMin).m_data[0] * local_248[0];
      threshold_1.m_data[3] = (this->m_texValueMin).m_data[3] * local_248[3];
      threshold_1.m_data[2] = (this->m_texValueMin).m_data[2] * local_248[2];
      res_17.m_data[1] = (this->m_texValueMax).m_data[1] * local_248[1];
      res_17.m_data[0] = (this->m_texValueMax).m_data[0] * local_248[0];
      res_17.m_data[3] = (this->m_texValueMax).m_data[3] * local_248[3];
      res_17.m_data[2] = (this->m_texValueMax).m_data[2] * local_248[2];
      getDerivateThreshold((Functional *)&res_5,precision,&threshold_1,&res_17,&reference);
      uVar13 = -(uint)(fVar20 <= threshold.m_data[2]);
      uVar15 = -(uint)(fVar22 <= threshold.m_data[3]);
      fVar28 = (float)(~-(uint)(res_5.m_data[0] <= threshold.m_data[0]) & (uint)res_5.m_data[0] |
                      (uint)threshold.m_data[0] & -(uint)(res_5.m_data[0] <= threshold.m_data[0]));
      fVar34 = (float)(~-(uint)(res_5.m_data[1] <= threshold.m_data[1]) & (uint)res_5.m_data[1] |
                      (uint)threshold.m_data[1] & -(uint)(res_5.m_data[1] <= threshold.m_data[1]));
      fVar20 = (float)(~uVar13 & (uint)fVar20 | (uint)threshold.m_data[2] & uVar13);
      fVar22 = (float)(~uVar15 & (uint)fVar22 | (uint)threshold.m_data[3] & uVar15);
      uVar13 = -(uint)(fVar28 <= surfaceThreshold.m_data[0]);
      uVar15 = -(uint)(fVar34 <= surfaceThreshold.m_data[1]);
      uVar14 = -(uint)(fVar20 <= surfaceThreshold.m_data[2]);
      uVar16 = -(uint)(fVar22 <= surfaceThreshold.m_data[3]);
      threshold_1.m_data[1] =
           (float)(~uVar15 & (uint)fVar34 | (uint)surfaceThreshold.m_data[1] & uVar15);
      threshold_1.m_data[0] =
           (float)(~uVar13 & (uint)fVar28 | (uint)surfaceThreshold.m_data[0] & uVar13);
      threshold_1.m_data[3] =
           (float)(~uVar16 & (uint)fVar22 | (uint)surfaceThreshold.m_data[3] & uVar16);
      threshold_1.m_data[2] =
           (float)(~uVar14 & (uint)fVar20 | (uint)surfaceThreshold.m_data[2] & uVar14);
      bVar4 = verifyConstantDerivate
                        (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_log,&compareArea,&maskArea,
                         (this->super_TriangleDerivateCase).m_dataType,&opThreshold,&threshold_1,
                         scale,&(this->super_TriangleDerivateCase).m_derivBias,LOG_ALL);
      iVar6 = (int)CONCAT71(extraout_var,bVar4);
    }
    return iVar6;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  res_2.m_data._0_8_ = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&res_2,"Too small viewport","");
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)&res_2);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void gen (void)
	{
		DE_ASSERT(!m_fbo);
		m_gl.genFramebuffers(1, &m_fbo);
	}